

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
emplace<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
          (iterator *__return_storage_ptr__,void *this,unsigned_long_long *key,
          shared_ptr<const_QGradientCache::CacheInfo> *args)

{
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *pDVar1;
  element_type *peVar2;
  long in_FS_OFFSET;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = *this;
  if (peVar2 == (element_type *)0x0) {
    local_38.d = (Data *)0x0;
    local_38.m_size = *(undefined8 *)((long)this + 8);
LAB_003c74d5:
    peVar2 = (element_type *)0x0;
LAB_003c74ff:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
             ::detached((Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                         *)peVar2);
    *(Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
      **)this = pDVar1;
LAB_003c7507:
    emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
              (__return_storage_ptr__,this,key,args);
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::~QMultiHash
              (&local_38);
  }
  else {
    if (1 < (uint)peVar2->buffer64[0].rgba) {
      local_38.m_size = *(undefined8 *)((long)this + 8);
      local_38.d = (Data *)peVar2;
      if ((int)peVar2->buffer64[0].rgba != -1) {
        LOCK();
        *(int *)&peVar2->buffer64[0].rgba = (int)peVar2->buffer64[0].rgba + 1;
        UNLOCK();
        peVar2 = *this;
        if (peVar2 == (element_type *)0x0) goto LAB_003c74d5;
      }
      if (1 < (uint)peVar2->buffer64[0].rgba) goto LAB_003c74ff;
      goto LAB_003c7507;
    }
    if (peVar2->buffer64[1].rgba < peVar2->buffer64[2].rgba >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_003c7590;
    }
    local_38.d = (Data *)(args->
                         super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
    local_38.m_size =
         (qsizetype)
         (args->super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size)->_M_use_count + 1;
      }
    }
    emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>>
              (__return_storage_ptr__,this,key,
               (shared_ptr<const_QGradientCache::CacheInfo> *)&local_38);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_003c7590:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }